

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

char * GetID(char **p)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  
  pcVar5 = *p;
  cVar1 = *pcVar5;
  while ((byte)(cVar1 - 1U) < 0x20) {
    pcVar5 = pcVar5 + 1;
    *p = pcVar5;
    cVar1 = *pcVar5;
  }
  if ((cVar1 != '\0') && (**p != 0)) {
    uVar6 = (uint)(byte)**p;
    iVar4 = isalpha(uVar6);
    if ((iVar4 != 0) || ((uVar6 == 0x5f || (uVar6 == 0x2e)))) {
      pcVar5 = nidtemp;
      while( true ) {
        pbVar3 = (byte *)*p;
        bVar2 = *pbVar3;
        iVar4 = isalnum((uint)bVar2);
        if ((iVar4 == 0) &&
           ((uVar6 = bVar2 - 0x21, 0x3e < uVar6 ||
            ((0x40000000c0002005U >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) break;
        *p = (char *)(pbVar3 + 1);
        *pcVar5 = *pbVar3;
        pcVar5 = (char *)((byte *)pcVar5 + 1);
      }
      *pcVar5 = 0;
      return nidtemp;
    }
  }
  return (char *)0x0;
}

Assistant:

char* GetID(char*& p) {
	char* np = nidtemp;
	if (SkipBlanks(p) || (!isLabelStart(p, false) && *p != '.')) return nullptr;
	while (islabchar((byte)*p)) *np++ = *p++;
	*np = 0;
	return nidtemp;
}